

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O1

void repackIfAllDigits(char *input,int aonly)

{
  int iVar1;
  char cVar2;
  byte bVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  char *s;
  
  pcVar4 = input + -2;
  pcVar6 = (char *)0x0;
  do {
    cVar2 = pcVar4[2];
    bVar3 = 1;
    if ((cVar2 == '\0') || (cVar2 == '-')) goto LAB_0016b1c9;
    if ((byte)(cVar2 - 0x3aU) < 0xf6) {
      bVar3 = 0;
      if ((cVar2 != '.') || (pcVar6 != (char *)0x0)) {
LAB_0016b1c9:
        if ((bool)(pcVar6 < pcVar4 & pcVar6 != (char *)0x0 & bVar3)) {
          if (aonly == 0) {
            uVar5 = ((int)pcVar4[1] + *pcVar4 * 10) - 0x210;
            *pcVar4 = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[(long)((int)uVar5 / 0x22) + 0x1f];
            uVar7 = ((int)uVar5 / 0x22) * 0x22;
          }
          else {
            cVar2 = pcVar4[1];
            iVar1 = *input * 100 + *pcVar4 * 10;
            uVar5 = (cVar2 + iVar1) - 0x14d0;
            *input = 'A';
            uVar7 = (iVar1 + cVar2) - 0x14b1;
            if (-1 < (int)uVar5) {
              uVar7 = uVar5;
            }
            *pcVar4 = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[(int)uVar7 >> 5];
            uVar7 = uVar7 & 0xffffffe0;
          }
          pcVar4[1] = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[(int)(uVar5 - uVar7)];
        }
        return;
      }
      pcVar6 = pcVar4 + 2;
    }
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

static void repackIfAllDigits(char *input, const int aonly) {
    char *s = input;
    int alldigits = 1; // assume all digits
    char *e;
    char *dotpos = NULL;
    ASSERT(input);
    for (e = s; *e != 0 && *e != '-'; e++) {
        if (*e < '0' || *e > '9') {
            if (*e == '.' && !dotpos) {
                dotpos = e;
            } else {
                alldigits = 0;
                break;
            }
        }
    }
    e--;
    s = e - 1;
    if (alldigits && dotpos &&
        s > dotpos) // e is last char, s is one before, both are beyond dot, all characters are digits
    {
        if (aonly) // v1.50 - encode only using the letter A
        {
            const int v = ((*input) - '0') * 100 + ((*s) - '0') * 10 + ((*e) - '0');
            *input = 'A';
            *s = ENCODE_CHARS[v / 32];
            *e = ENCODE_CHARS[v % 32];
        } else // encode using A,E,U
        {
            const int v = ((*s) - '0') * 10 + ((*e) - '0');
            *s = ENCODE_CHARS[(v / 34) + 31];
            *e = ENCODE_CHARS[v % 34];
        }
    }
}